

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

int __thiscall QPDFWriter::openObject(QPDFWriter *this,int objid)

{
  element_type *peVar1;
  qpdf_offset_t offset;
  NewObject *pNVar2;
  string_view local_80 [2];
  string local_60;
  string_view local_40;
  QPDFXRefEntry local_30;
  int local_14;
  QPDFWriter *pQStack_10;
  int objid_local;
  QPDFWriter *this_local;
  
  local_14 = objid;
  pQStack_10 = this;
  if (objid == 0) {
    peVar1 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    local_14 = peVar1->next_objid;
    peVar1->next_objid = local_14 + 1;
  }
  peVar1 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  offset = ::qpdf::pl::Count::getCount(peVar1->pipeline);
  QPDFXRefEntry::QPDFXRefEntry(&local_30,offset);
  peVar1 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  pNVar2 = ObjTable<QPDFWriter::NewObject>::operator[]
                     (&(peVar1->new_obj).super_ObjTable<QPDFWriter::NewObject>,local_14);
  (pNVar2->xref).field2 = local_30.field2;
  (pNVar2->xref).type = local_30.type;
  *(undefined4 *)&(pNVar2->xref).field_0x4 = local_30._4_4_;
  (pNVar2->xref).field1 = local_30.field1;
  std::__cxx11::to_string(&local_60,local_14);
  local_40 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_60);
  writeString(this,local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_80," 0 obj\n");
  writeString(this,local_80[0]);
  return local_14;
}

Assistant:

int
QPDFWriter::openObject(int objid)
{
    if (objid == 0) {
        objid = m->next_objid++;
    }
    m->new_obj[objid].xref = QPDFXRefEntry(m->pipeline->getCount());
    writeString(std::to_string(objid));
    writeString(" 0 obj\n");
    return objid;
}